

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

int encode_image(void *image,size_t length,uint32_t width,uint32_t height,spng_color_type color_type
                ,int bit_depth)

{
  undefined8 uVar1;
  void *__ptr;
  void *png_buf;
  size_t png_size;
  spng_ihdr ihdr;
  spng_ctx *ctx;
  int ret;
  int fmt;
  int bit_depth_local;
  spng_color_type color_type_local;
  uint32_t height_local;
  uint32_t width_local;
  size_t length_local;
  void *image_local;
  
  ctx._0_4_ = 0;
  ihdr.bit_depth = '\0';
  ihdr.color_type = '\0';
  ihdr.compression_method = '\0';
  ihdr.filter_method = '\0';
  ihdr.interlace_method = '\0';
  ihdr._13_3_ = 0;
  ret = bit_depth;
  fmt = color_type;
  bit_depth_local = height;
  color_type_local = width;
  _height_local = length;
  length_local = (size_t)image;
  memset(&png_size,0,0x10);
  ihdr._8_8_ = spng_ctx_new(2);
  spng_set_option(ihdr._8_8_,0xc,1);
  png_size._0_4_ = color_type_local;
  png_size._4_4_ = bit_depth_local;
  ihdr.width._1_1_ = (undefined1)fmt;
  ihdr.width._0_1_ = (undefined1)ret;
  spng_set_ihdr(ihdr._8_8_,&png_size);
  ctx._4_4_ = 0x100;
  ctx._0_4_ = spng_encode_image(ihdr._8_8_,length_local,_height_local,0x100,2);
  if ((int)ctx == 0) {
    __ptr = (void *)spng_get_png_buffer(ihdr._8_8_,&png_buf,&ctx);
    if (__ptr == (void *)0x0) {
      uVar1 = spng_strerror((int)ctx);
      printf("spng_get_png_buffer() error: %s\n",uVar1);
    }
    free(__ptr);
  }
  else {
    uVar1 = spng_strerror((int)ctx);
    printf("spng_encode_image() error: %s\n",uVar1);
  }
  spng_ctx_free(ihdr._8_8_);
  return (int)ctx;
}

Assistant:

int encode_image(void *image, size_t length, uint32_t width, uint32_t height, enum spng_color_type color_type, int bit_depth)
{
    int fmt;
    int ret = 0;
    spng_ctx *ctx = NULL;
    struct spng_ihdr ihdr = {0}; /* zero-initialize to set valid defaults */

    /* Creating an encoder context requires a flag */
    ctx = spng_ctx_new(SPNG_CTX_ENCODER);

    /* Encode to internal buffer managed by the library */
    spng_set_option(ctx, SPNG_ENCODE_TO_BUFFER, 1);

    /* Alternatively you can set an output FILE* or stream with spng_set_png_file() or spng_set_png_stream() */

    /* Set image properties, this determines the destination image format */
    ihdr.width = width;
    ihdr.height = height;
    ihdr.color_type = color_type;
    ihdr.bit_depth = bit_depth;
    /* Valid color type, bit depth combinations: https://www.w3.org/TR/2003/REC-PNG-20031110/#table111 */

    spng_set_ihdr(ctx, &ihdr);

    /* When encoding fmt is the source format */
    /* SPNG_FMT_PNG is a special value that matches the format in ihdr */
    fmt = SPNG_FMT_PNG;

    /* SPNG_ENCODE_FINALIZE will finalize the PNG with the end-of-file marker */
    ret = spng_encode_image(ctx, image, length, fmt, SPNG_ENCODE_FINALIZE);

    if(ret)
    {
        printf("spng_encode_image() error: %s\n", spng_strerror(ret));
        goto encode_error;
    }

    size_t png_size;
    void *png_buf = NULL;

    /* Get the internal buffer of the finished PNG */
    png_buf = spng_get_png_buffer(ctx, &png_size, &ret);

    if(png_buf == NULL)
    {
        printf("spng_get_png_buffer() error: %s\n", spng_strerror(ret));
    }

    /* User owns the buffer after a successful call */
    free(png_buf);

encode_error:

    spng_ctx_free(ctx);

    return ret;
}